

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  
  if (from != to) {
    pTVar3 = to->top;
    if ((long)((ulong)(to->maxstack).ptr32 - (long)pTVar3) <= (long)((ulong)(uint)n * 8)) {
      lj_state_growstack(to,n);
      pTVar3 = to->top;
    }
    pTVar2 = from->top;
    to->top = pTVar3 + n;
    pTVar3 = pTVar3 + n;
    for (; pTVar3 = pTVar3 + -1, 0 < n; n = n + -1) {
      pTVar1 = pTVar2 + -1;
      pTVar2 = pTVar2 + -1;
      *pTVar3 = *pTVar1;
    }
    from->top = pTVar2;
  }
  return;
}

Assistant:

LUA_API void lua_xmove(lua_State *from, lua_State *to, int n)
{
  TValue *f, *t;
  if (from == to) return;
  api_checknelems(from, n);
  api_check(from, G(from) == G(to));
  lj_state_checkstack(to, (MSize)n);
  f = from->top;
  t = to->top = to->top + n;
  while (--n >= 0) copyTV(to, --t, --f);
  from->top = f;
}